

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

int __thiscall HttpResponse::buildFirstLine(HttpResponse *this)

{
  int iVar1;
  char *pcVar2;
  char local_28 [4];
  int res;
  char statusCodeBuf [17];
  HttpResponse *this_local;
  
  statusCodeBuf[8] = '\0';
  unique0x100001ee = this;
  iVar1 = snprintf(local_28,0x10,"%d",(ulong)(uint)this->mResponseCode);
  if (0xf < iVar1) {
    jh_log_print(1,"virtual int HttpResponse::buildFirstLine() const",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpResponse.cpp"
                 ,0x103,"mResponseCode %d exceeds kStatusCodeSize %d",
                 (ulong)(uint)this->mResponseCode,0x10);
  }
  std::__cxx11::string::operator=
            ((string *)&(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr,"HTTP/1.1 ");
  std::__cxx11::string::operator+=
            ((string *)&(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr,local_28);
  std::__cxx11::string::operator+=
            ((string *)&(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr," ");
  pcVar2 = getResponseString(this,this->mResponseCode);
  std::__cxx11::string::operator+=
            ((string *)&(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr,pcVar2);
  std::__cxx11::string::operator+=
            ((string *)&(this->super_HttpHeader).super_HttpHeaderBase.mHeaderStr,"\r\n");
  iVar1 = std::__cxx11::string::size();
  return iVar1;
}

Assistant:

int HttpResponse::buildFirstLine() const
{
	char statusCodeBuf[kStatusCodeSize + 1];
	statusCodeBuf[kStatusCodeSize] = '\0'; // terminate in case of error

	int res = snprintf(statusCodeBuf, kStatusCodeSize, "%d", mResponseCode);
	
	if (res >= kStatusCodeSize)
	{
		LOG_ERR_FATAL("mResponseCode %d exceeds kStatusCodeSize %d",
					  mResponseCode, kStatusCodeSize);
	}

	mHeaderStr = "HTTP/1.1 ";
	mHeaderStr += statusCodeBuf;
	mHeaderStr += " ";
	mHeaderStr += getResponseString(mResponseCode);
	mHeaderStr += "\r\n";
	
	return mHeaderStr.size();
}